

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timeout.c
# Opt level: O0

void run_timers(void)

{
  timer_element *__ptr;
  bool bVar1;
  timer_element *curr;
  
  while( true ) {
    bVar1 = false;
    if (level->lev_timers != (timer_element *)0x0) {
      bVar1 = level->lev_timers->timeout <= moves;
    }
    if (!bVar1) break;
    __ptr = level->lev_timers;
    level->lev_timers = __ptr->next;
    if (__ptr->kind == 2) {
      *(char *)((long)__ptr->arg + 0x49) = *(char *)((long)__ptr->arg + 0x49) + -1;
    }
    (*timeout_funcs[__ptr->func_index].f)(__ptr->arg,(long)__ptr->timeout);
    free(__ptr);
  }
  return;
}

Assistant:

void run_timers(void)
{
    timer_element *curr;

    /*
     * Always use the first element.  Elements may be added or deleted at
     * any time.  The list is ordered, we are done when the first element
     * is in the future.
     */
    while (level->lev_timers && level->lev_timers->timeout <= moves) {
	curr = level->lev_timers;
	level->lev_timers = curr->next;

	if (curr->kind == TIMER_OBJECT) ((struct obj *)(curr->arg))->timed--;
	(*timeout_funcs[curr->func_index].f)(curr->arg, curr->timeout);
	free(curr);
    }
}